

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O3

bool cmAddCustomTargetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  size_type sVar8;
  string *psVar9;
  long lVar10;
  cmTarget *this;
  uint uVar11;
  ulong uVar12;
  string *__x;
  byte bVar13;
  ulong uVar14;
  pointer pbVar15;
  cmCustomCommand *pcVar16;
  byte bVar17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  undefined1 auVar18 [16];
  __single_object cc;
  cmCustomCommandLine currentLine;
  string filename;
  string comment_buffer;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string job_pool;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_248 [32];
  undefined8 local_228;
  char *local_220;
  cmMakefile *local_218;
  pointer local_210;
  uint local_204;
  ulong local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1e0 [32];
  char *local_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_198;
  ulong local_180;
  undefined8 local_178;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  string local_148;
  char *local_128;
  undefined8 local_120;
  char local_118;
  undefined7 uStack_117;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_c8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_c8.field_2._M_allocated_capacity = local_248._16_8_;
    local_c8._M_dataplus._M_p = (pointer)local_248._0_8_;
    if ((undefined1 *)local_248._0_8_ == local_248 + 0x10) {
      return false;
    }
LAB_001a508d:
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    return false;
  }
  pcVar2 = status->Makefile;
  auVar18 = std::__cxx11::string::find_first_of((char *)pbVar1,0x686f4c,0);
  if (auVar18._0_8_ != -1) {
    local_248._24_8_ = (pbVar1->_M_dataplus)._M_p;
    local_248._16_8_ = pbVar1->_M_string_length;
    local_248._0_8_ = (pointer)0x21;
    local_248._8_8_ = "called with invalid target name \"";
    local_228 = 0x54;
    local_220 = 
    "\".  Target names may not contain a slash.  Use ADD_CUSTOM_COMMAND to generate files.";
    views._M_len = 3;
    views._M_array = (iterator)local_248;
    cmCatViews_abi_cxx11_(&local_c8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      return false;
    }
    goto LAB_001a508d;
  }
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  local_1b8 = &local_1a8;
  local_1b0 = 0;
  local_1a8 = '\0';
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15;
  uVar11 = 1;
  local_218 = pcVar2;
  local_210 = pbVar1;
  if (uVar6 < 0x21) {
    local_204 = (uint)CONCAT71(auVar18._9_7_,1);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)(pbVar15 + 1));
    local_204 = (uint)(iVar5 != 0);
    uVar11 = 2 - local_204;
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15;
  }
  uVar12 = (ulong)uVar11;
  uVar14 = 0;
  if (uVar12 < (ulong)((long)uVar6 >> 5)) {
    local_1c0 = (char *)0x0;
    local_200 = 0;
    local_180 = 0;
    local_178 = 0;
LAB_001a51bd:
    uVar11 = uVar11 + 1;
    __x = pbVar15 + uVar12;
    iVar5 = std::__cxx11::string::compare((char *)__x);
    uVar6 = 1;
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)__x);
      uVar6 = 2;
      if (iVar5 != 0) {
        iVar5 = std::__cxx11::string::compare((char *)__x);
        uVar6 = 3;
        if (iVar5 != 0) {
          uVar7 = std::__cxx11::string::compare((char *)__x);
          if ((int)uVar7 == 0) {
            local_178 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          }
          else {
            uVar7 = std::__cxx11::string::compare((char *)__x);
            if ((int)uVar7 == 0) {
              local_180 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
            else {
              uVar7 = std::__cxx11::string::compare((char *)__x);
              if ((int)uVar7 != 0) {
                iVar5 = std::__cxx11::string::compare((char *)__x);
                if (iVar5 == 0) {
LAB_001a5396:
                  uVar6 = 4;
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)__x);
                  if (iVar5 == 0) {
                    uVar6 = 6;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)__x);
                    if (iVar5 == 0) {
                      uVar6 = 0;
                      if (local_1f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          local_1f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
                        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                        push_back(&local_198,(value_type *)&local_1f8);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::_M_erase_at_end(&local_1f8,
                                          local_1f8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)__x);
                      if (iVar5 == 0) {
                        uVar6 = 5;
                      }
                      else {
                        switch(uVar14) {
                        case 0:
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&local_1f8,__x);
                          uVar6 = 0;
                          break;
                        case 1:
                          local_248._0_8_ = local_248 + 0x10;
                          pcVar3 = (__x->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_248,pcVar3,pcVar3 + __x->_M_string_length);
                          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_248);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_e8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_248);
                          if ((cmCustomCommand *)local_248._0_8_ !=
                              (cmCustomCommand *)(local_248 + 0x10)) {
                            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                          }
                          uVar6 = 1;
                          break;
                        case 2:
                          local_1e0._0_8_ = local_1e0 + 0x10;
                          local_1e0._8_8_ = 0;
                          local_1e0[0x10] = '\0';
                          bVar4 = cmsys::SystemTools::FileIsFullPath(__x);
                          if ((!bVar4) && (sVar8 = cmGeneratorExpression::Find(__x), sVar8 != 0)) {
                            psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_218);
                            local_c8._M_string_length = (size_type)(psVar9->_M_dataplus)._M_p;
                            local_c8._M_dataplus._M_p = (pointer)psVar9->_M_string_length;
                            local_248._0_8_ = (cmCustomCommand *)0x1;
                            local_248._8_8_ = local_248 + 0x10;
                            local_248[0x10] = 0x2f;
                            local_c8.field_2._M_allocated_capacity = 1;
                            views_00._M_len = 2;
                            views_00._M_array = (iterator)&local_c8;
                            local_c8.field_2._8_8_ = local_248._8_8_;
                            cmCatViews_abi_cxx11_(&local_50,views_00);
                            std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_50)
                            ;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
                              operator_delete(local_50._M_dataplus._M_p,
                                              local_50.field_2._M_allocated_capacity + 1);
                            }
                          }
                          std::__cxx11::string::_M_append
                                    ((char *)local_1e0,(ulong)(__x->_M_dataplus)._M_p);
                          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1e0);
                          bVar4 = cmsys::SystemTools::FileIsFullPath((string *)local_1e0);
                          if (bVar4) {
                            cmsys::SystemTools::CollapseFullPath
                                      ((string *)local_248,(string *)local_1e0);
                            std::__cxx11::string::operator=((string *)local_1e0,(string *)local_248)
                            ;
                            if ((cmCustomCommand *)local_248._0_8_ !=
                                (cmCustomCommand *)(local_248 + 0x10)) {
                              operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
                            }
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&local_168,(string *)local_1e0);
                          if ((cmCustomCommand *)local_1e0._0_8_ !=
                              (cmCustomCommand *)(local_1e0 + 0x10)) {
                            operator_delete((void *)local_1e0._0_8_,
                                            CONCAT71(local_1e0._17_7_,local_1e0[0x10]) + 1);
                          }
                          uVar6 = 2;
                          break;
                        case 3:
                          std::__cxx11::string::_M_assign((string *)&local_128);
                          break;
                        case 4:
                          std::__cxx11::string::_M_assign((string *)&local_1b8);
                          local_1c0 = local_1b8;
                          goto LAB_001a5396;
                        case 5:
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&local_108,__x);
                          uVar6 = 5;
                          break;
                        case 6:
                          std::__cxx11::string::_M_assign((string *)&local_148);
                          uVar6 = 6;
                          break;
                        default:
                          local_248._0_8_ = local_248 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_248,"Wrong syntax. Unknown type of argument.",
                                     "");
                          std::__cxx11::string::_M_assign((string *)&status->Error);
                          sVar8 = local_248._16_8_;
                          pcVar16 = (cmCustomCommand *)local_248._0_8_;
                          if ((cmCustomCommand *)local_248._0_8_ !=
                              (cmCustomCommand *)(local_248 + 0x10)) goto LAB_001a5694;
                          goto LAB_001a5a6e;
                        }
                      }
                    }
                  }
                }
                goto LAB_001a530e;
              }
              local_200 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
          }
          uVar6 = 7;
        }
      }
    }
LAB_001a530e:
    uVar14 = uVar6;
    uVar12 = (ulong)uVar11;
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5) <= uVar12)
    goto LAB_001a55c7;
    goto LAB_001a51bd;
  }
  local_200 = 0;
  local_1c0 = (char *)0x0;
  bVar17 = 1;
  goto LAB_001a55eb;
LAB_001a55c7:
  bVar17 = (byte)local_178 ^ 1;
  uVar14 = local_180;
LAB_001a55eb:
  pbVar1 = local_210;
  bVar13 = (byte)uVar14;
  lVar10 = std::__cxx11::string::find_first_of((char *)local_210,0x67c937,0);
  if (lVar10 == -1) {
    bVar4 = cmGeneratorExpression::IsValidTargetName(pbVar1);
    if ((((bVar4) && (bVar4 = cmGlobalGenerator::IsReservedTarget(local_210), !bVar4)) &&
        (lVar10 = std::__cxx11::string::find((char)local_210,0x3a), lVar10 == -1)) ||
       (bVar4 = cmMakefile::CheckCMP0037(local_218,local_210,UTILITY), bVar4)) {
      if (local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&local_198,(value_type *)&local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&local_1f8,
                          local_1f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar16 = (cmCustomCommand *)(local_248 + 0x10);
      local_248._8_8_ = (char *)0x0;
      local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
      local_248._0_8_ = pcVar16;
      bVar4 = cmMakefile::EnforceUniqueName(local_218,local_210,(string *)local_248,true);
      if (bVar4) {
        if ((cmCustomCommand *)local_248._0_8_ != pcVar16) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
        if (local_198.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_198.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (local_168.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_168.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((uVar14 & 1) == 0) {
              if ((local_200 & 1) == 0) {
                bVar13 = 0;
                goto LAB_001a58ac;
              }
              local_248._0_8_ = pcVar16;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_248,
                         "COMMAND_EXPAND_LISTS may not be specified without any COMMAND","");
              cmMakefile::IssueMessage(local_218,FATAL_ERROR,(string *)local_248);
            }
            else {
              local_248._0_8_ = pcVar16;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_248,
                         "USES_TERMINAL may not be specified without any COMMAND","");
              cmMakefile::IssueMessage(local_218,FATAL_ERROR,(string *)local_248);
            }
          }
          else {
            local_248._0_8_ = pcVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,"BYPRODUCTS may not be specified without any COMMAND","")
            ;
            cmMakefile::IssueMessage(local_218,FATAL_ERROR,(string *)local_248);
          }
          if ((cmCustomCommand *)local_248._0_8_ != pcVar16) {
            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          }
          bVar4 = true;
          goto LAB_001a5a70;
        }
        if ((local_148._M_string_length != 0 & bVar13) != 1) {
LAB_001a58ac:
          std::make_unique<cmCustomCommand>();
          cmCustomCommand::SetWorkingDirectory((cmCustomCommand *)local_248._0_8_,local_128);
          uVar7 = local_248._0_8_;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_68,&local_168);
          cmCustomCommand::SetByproducts((cmCustomCommand *)uVar7,&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          uVar7 = local_248._0_8_;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_80,&local_e8);
          cmCustomCommand::SetDepends((cmCustomCommand *)uVar7,&local_80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_80);
          uVar7 = local_248._0_8_;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_98,&local_198);
          cmCustomCommand::SetCommandLines
                    ((cmCustomCommand *)uVar7,(cmCustomCommandLines *)&local_98);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_98)
          ;
          cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_248._0_8_,(bool)(bVar17 & 1));
          cmCustomCommand::SetComment((cmCustomCommand *)local_248._0_8_,local_1c0);
          cmCustomCommand::SetUsesTerminal((cmCustomCommand *)local_248._0_8_,(bool)(bVar13 & 1));
          cmCustomCommand::SetCommandExpandLists
                    ((cmCustomCommand *)local_248._0_8_,(bool)((byte)local_200 & 1));
          cmCustomCommand::SetJobPool((cmCustomCommand *)local_248._0_8_,&local_148);
          local_170._M_t.
          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
               (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
               local_248._0_8_;
          local_248._0_8_ = (cmCustomCommand *)0x0;
          this = cmMakefile::AddUtilityCommand(local_218,local_210,local_204._0_1_,&local_170);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    (&local_170);
          cmTarget::AddSources(this,&local_108);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_248
                    );
          bVar4 = true;
          goto LAB_001a5a70;
        }
        local_248._0_8_ = pcVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"JOB_POOL is shadowed by USES_TERMINAL.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      if ((cmCustomCommand *)local_248._0_8_ != pcVar16) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      bVar4 = false;
      goto LAB_001a5a70;
    }
  }
  else {
    local_248._24_8_ = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)0x1;
    local_c8.field_2._M_local_buf[0] = (pbVar1->_M_dataplus)._M_p[lVar10];
    local_248._0_8_ = (cmCustomCommand *)0x26;
    local_248._8_8_ = "called with target name containing a \"";
    local_248._16_8_ = 1;
    local_228 = 0x22;
    local_220 = "\".  This character is not allowed.";
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_248;
    local_c8._M_string_length = local_248._24_8_;
    cmCatViews_abi_cxx11_((string *)local_1e0,views_01);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((cmCustomCommand *)local_1e0._0_8_ != (cmCustomCommand *)(local_1e0 + 0x10)) {
      sVar8 = CONCAT71(local_1e0._17_7_,local_1e0[0x10]);
      pcVar16 = (cmCustomCommand *)local_1e0._0_8_;
LAB_001a5694:
      operator_delete(pcVar16,sVar8 + 1);
    }
  }
LAB_001a5a6e:
  bVar4 = false;
LAB_001a5a70:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return bVar4;
}

Assistant:

bool cmAddCustomTargetCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    status.SetError(cmStrCat("called with invalid target name \"", targetName,
                             "\".  Target names may not contain a slash.  "
                             "Use ADD_CUSTOM_COMMAND to generate files."));
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends;
  std::vector<std::string> byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy) &&
              cmGeneratorExpression::Find(copy) != 0) {
            filename = cmStrCat(mf.GetCurrentBinaryDirectory(), '/');
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          if (cmSystemTools::FileIsFullPath(filename)) {
            filename = cmSystemTools::CollapseFullPath(filename);
          }
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        default:
          status.SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    status.SetError(cmStrCat("called with target name containing a \"",
                             targetName[pos],
                             "\".  This character is not allowed."));
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(targetName, msg, true)) {
      status.SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    status.SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetWorkingDirectory(working_directory.c_str());
  cc->SetByproducts(byproducts);
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetEscapeOldStyle(!verbatim);
  cc->SetComment(comment);
  cc->SetUsesTerminal(uses_terminal);
  cc->SetCommandExpandLists(command_expand_lists);
  cc->SetJobPool(job_pool);
  cmTarget* target =
    mf.AddUtilityCommand(targetName, excludeFromAll, std::move(cc));

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}